

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

int __thiscall MIDIStreamer::ClampLoopCount(MIDIStreamer *this,int loopcount)

{
  int iVar1;
  
  iVar1 = this->LoopLimit;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      return 1;
    }
    if (loopcount == 0) {
      loopcount = iVar1;
    }
  }
  return loopcount;
}

Assistant:

int MIDIStreamer::ClampLoopCount(int loopcount)
{
	if (LoopLimit == 0)
	{
		return loopcount;
	}
	if (LoopLimit == 1)
	{
		return 1;
	}
	if (loopcount == 0)
	{
		return LoopLimit;
	}
	return loopcount;
}